

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.cpp
# Opt level: O1

void __thiscall Draw::PrintUi(Draw *this,GameData *Data,bool flagQuit,bool flagGameOver)

{
  int iVar1;
  int num;
  long *plVar2;
  long lVar3;
  char *pcVar4;
  GameData *pGVar5;
  int j;
  int y;
  int i;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"            HAPPY!     SCORE: ",0x1e);
  pGVar5 = Data;
  iVar1 = GameData::GetScore(Data);
  PrintNumAlignCenter((Draw *)pGVar5,iVar1,6,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     BEST: ",0xb);
  pGVar5 = Data;
  iVar1 = GameData::GetBestScore(Data);
  PrintNumAlignCenter((Draw *)pGVar5,iVar1,6,true);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"     !HAPPY",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            ----------------------------------------------------",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"                       |------|------|------|------|",0x34);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  iVar1 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"                       |",0x18);
    y = 0;
    do {
      pGVar5 = Data;
      num = GameData::GetPositionNumber(Data,iVar1,y);
      PrintNumAlignCenter((Draw *)pGVar5,num,6,false);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"|",1);
      y = y + 1;
    } while (y != 4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"                       |------|------|------|------|",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    iVar1 = iVar1 + 1;
  } while (iVar1 != 4);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "            ----------------------------------------------------",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (flagGameOver) {
    pcVar4 = "                Do you want to play the game again?([Y]/[N])              ";
  }
  else {
    if (!flagQuit) {
      pcVar4 = "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT";
      lVar3 = 0x3d;
      goto LAB_00102c19;
    }
    pcVar4 = "                Do you really want to quite the game?([Y]/[N])            ";
  }
  lVar3 = 0x4a;
LAB_00102c19:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  return;
}

Assistant:

void Draw::PrintUi(GameData Data, bool flagQuit, bool flagGameOver) {
    std::cout << "            HAPPY!     SCORE: ";
    PrintNumAlignCenter(Data.GetScore(), 6, true);
    std::cout << "     BEST: ";
    PrintNumAlignCenter(Data.GetBestScore(), 6, true);
    std::cout << "     !HAPPY" << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    std::cout << std::endl << std::endl;
    std::cout << "                       |------|------|------|------|" << std::endl;

    for (int i = 0; i < 4; i++) {
        std::cout << "                       |";
        for (int j = 0; j < 4; j++) {
            PrintNumAlignCenter(Data.GetPositionNumber(i, j), 6, false);
            std::cout << ("|");
        }
        std::cout << std::endl;
        std::cout << "                       |------|------|------|------|" << std::endl;
    }

    std::cout << std::endl << std::endl;
    std::cout << "            ----------------------------------------------------" << std::endl;
    if (flagGameOver)
        std::cout << "                Do you want to play the game again?([Y]/[N])              " << std::endl;
    else if (flagQuit)
        std::cout << "                Do you really want to quite the game?([Y]/[N])            " << std::endl;
    else
        std::cout << "              [W]:UP  [S]:DOWN  [A]:LEFT  [D]:RIGHT  [Q]:EXIT" << std::endl;
}